

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

bool __thiscall leveldb::Block::Iter::ParseNextKey(Iter *this)

{
  byte *limit;
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  byte *pbVar8;
  uint *puVar9;
  uint32_t non_shared;
  uint32_t value_length;
  uint32_t shared;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  pcVar2 = this->data_;
  pcVar5 = (this->value_).data_ + ((this->value_).size_ - (long)pcVar2);
  uVar4 = (uint)pcVar5;
  this->current_ = uVar4;
  uVar7 = this->restarts_;
  if (uVar7 <= uVar4) {
    this->current_ = uVar7;
    this->restart_index_ = this->num_restarts_;
    return false;
  }
  uVar6 = (ulong)pcVar5 & 0xffffffff;
  if ((long)(uVar7 - uVar6) < 3) {
LAB_00126faf:
    pbVar3 = (byte *)0x0;
  }
  else {
    limit = (byte *)(pcVar2 + uVar7);
    pbVar8 = (byte *)(pcVar2 + uVar6);
    local_1c = (uint)*pbVar8;
    local_24 = (uint)pbVar8[1];
    local_20 = (uint)pbVar8[2];
    if ((byte)(pbVar8[1] | *pbVar8 | pbVar8[2]) < 0x80) {
      pbVar8 = pbVar8 + 3;
    }
    else {
      if (uVar4 < uVar7) {
        uVar7 = (uint)(char)*pbVar8;
        pbVar3 = (byte *)(ulong)uVar7;
        if ((int)uVar7 < 0) goto LAB_0012709f;
        pbVar8 = pbVar8 + 1;
        local_1c = uVar7;
      }
      else {
LAB_0012709f:
        pbVar3 = (byte *)GetVarint32PtrFallback((char *)pbVar8,(char *)limit,&local_1c);
        pbVar8 = pbVar3;
      }
      if (pbVar8 == (byte *)0x0) goto LAB_00126faf;
      if (pbVar8 < limit) {
        bVar1 = *pbVar8;
        if (-1 < (char)bVar1) {
          pbVar3 = pbVar8 + 1;
          local_24 = (int)(char)bVar1;
        }
        if ((char)bVar1 < '\0') goto LAB_001270d2;
      }
      else {
LAB_001270d2:
        pbVar3 = (byte *)GetVarint32PtrFallback((char *)pbVar8,(char *)limit,&local_24);
      }
      if (pbVar3 == (byte *)0x0) goto LAB_00126faf;
      if (pbVar3 < limit) {
        bVar1 = *pbVar3;
        if (-1 < (char)bVar1) {
          pbVar8 = pbVar3 + 1;
          local_20 = (int)(char)bVar1;
        }
        if ((char)bVar1 < '\0') goto LAB_00127102;
      }
      else {
LAB_00127102:
        pbVar8 = (byte *)GetVarint32PtrFallback((char *)pbVar3,(char *)limit,&local_20);
      }
      if (pbVar8 == (byte *)0x0) goto LAB_00126faf;
    }
    pbVar3 = (byte *)0x0;
    if (local_20 + local_24 <= (uint)((int)limit - (int)pbVar8)) {
      pbVar3 = pbVar8;
    }
  }
  if ((pbVar3 != (byte *)0x0) && ((ulong)local_1c <= (this->key_)._M_string_length)) {
    std::__cxx11::string::resize((ulong)&this->key_,(char)local_1c);
    std::__cxx11::string::append((char *)&this->key_,(ulong)pbVar3);
    (this->value_).data_ = (char *)(pbVar3 + local_24);
    (this->value_).size_ = (ulong)local_20;
    uVar7 = this->restart_index_ + 1;
    if (this->num_restarts_ <= uVar7) {
      return true;
    }
    puVar9 = (uint *)(this->data_ + (ulong)this->restarts_ + (ulong)uVar7 * 4);
    do {
      if (this->current_ <= *puVar9) {
        return true;
      }
      this->restart_index_ = uVar7;
      uVar7 = uVar7 + 1;
      puVar9 = puVar9 + 1;
    } while (this->num_restarts_ != uVar7);
    return true;
  }
  CorruptionError(this);
  return false;
}

Assistant:

bool ParseNextKey() {
    current_ = NextEntryOffset();
    const char* p = data_ + current_;
    const char* limit = data_ + restarts_;  // Restarts come right after data
    if (p >= limit) {
      // No more entries to return.  Mark as invalid.
      current_ = restarts_;
      restart_index_ = num_restarts_;
      return false;
    }

    // Decode next entry
    uint32_t shared, non_shared, value_length;
    p = DecodeEntry(p, limit, &shared, &non_shared, &value_length);
    if (p == nullptr || key_.size() < shared) {
      CorruptionError();
      return false;
    } else {
      key_.resize(shared);
      key_.append(p, non_shared);
      value_ = Slice(p + non_shared, value_length);
      while (restart_index_ + 1 < num_restarts_ &&
             GetRestartPoint(restart_index_ + 1) < current_) {
        ++restart_index_;
      }
      return true;
    }
  }